

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtranslator.cpp
# Opt level: O3

bool __thiscall
QTranslatorPrivate::do_load(QTranslatorPrivate *this,uchar *data,qsizetype len,QString *directory)

{
  byte bVar1;
  QArrayData *data_00;
  QIODevice *pQVar2;
  undefined1 *puVar3;
  pointer puVar4;
  pointer puVar5;
  bool bVar6;
  uint uVar7;
  QTranslator *pQVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  pointer *__ptr;
  long lVar12;
  pointer puVar13;
  QString *pQVar14;
  byte *pbVar15;
  char16_t *pcVar16;
  long in_FS_OFFSET;
  QByteArrayView ba;
  _Head_base<0UL,_QTranslator_*,_false> local_a0;
  QString local_98;
  QArrayDataPointer<QString> local_78;
  undefined1 local_58 [16];
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.d = (Data *)0x0;
  local_78.ptr = (QString *)0x0;
  local_78.size = 0;
  if (0x15 < len) {
    pbVar15 = data + 0x10;
    do {
      bVar1 = *pbVar15;
      if ((bVar1 == 0) || (uVar7 = *(uint *)(pbVar15 + 1), uVar7 == 0)) break;
      pcVar16 = (char16_t *)(pbVar15 + 5);
      uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
      if ((uint)(((int)data + (int)len) - (int)pcVar16) < uVar7) goto LAB_002caebe;
      pQVar14 = (QString *)(ulong)uVar7;
      if (bVar1 < 0x88) {
        if (bVar1 == 0x2f) {
          this->contextArray = (uchar *)pcVar16;
          this->contextLength = uVar7;
        }
        else if (bVar1 == 0x42) {
          this->offsetArray = (uchar *)pcVar16;
          this->offsetLength = uVar7;
        }
        else if (bVar1 == 0x69) {
          this->messageArray = (uchar *)pcVar16;
          this->messageLength = uVar7;
        }
      }
      else if (bVar1 == 0x88) {
        this->numerusRulesArray = (uchar *)pcVar16;
        this->numerusRulesLength = uVar7;
      }
      else if (bVar1 == 0x96) {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_98.d.d = (Data *)0x0;
        local_98.d.ptr = pcVar16;
        local_98.d.size = (qsizetype)pQVar14;
        QDataStream::QDataStream((QDataStream *)local_58,(QByteArray *)&local_98);
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
          }
        }
        local_98.d.d = (Data *)0x0;
        local_98.d.ptr = (char16_t *)0x0;
        local_98.d.size = 0;
        while (bVar6 = QDataStream::atEnd((QDataStream *)local_58), !bVar6) {
          ::operator>>((QDataStream *)local_58,&local_98);
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)&local_78,local_78.size,&local_98);
          QList<QString>::end((QList<QString> *)&local_78);
        }
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
          }
        }
        QDataStream::~QDataStream((QDataStream *)local_58);
      }
      else if (bVar1 == 0xa7) {
        ba.m_data._0_1_ = 0xa7;
        ba.m_size = (qsizetype)pcVar16;
        ba.m_data._1_7_ = 0;
        QString::fromUtf8((QString *)local_58,pQVar14,ba);
        data_00 = &((this->language).d.d)->super_QArrayData;
        pQVar2 = (QIODevice *)(this->language).d.ptr;
        *(undefined4 *)&(this->language).d.d = local_58._0_4_;
        *(undefined4 *)((long)&(this->language).d.d + 4) = local_58._4_4_;
        *(undefined4 *)&(this->language).d.ptr = local_58._8_4_;
        *(undefined4 *)((long)&(this->language).d.ptr + 4) = local_58._12_4_;
        puVar3 = (undefined1 *)(this->language).d.size;
        (this->language).d.size = (qsizetype)local_48;
        local_58._0_8_ = data_00;
        local_58._8_8_ = pQVar2;
        local_48 = puVar3;
        if (data_00 != (QArrayData *)0x0) {
          LOCK();
          (data_00->ref_)._q_value.super___atomic_base<int>._M_i =
               (data_00->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((data_00->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(data_00,2,0x10);
          }
        }
      }
      pbVar15 = (byte *)((long)pcVar16 + (long)pQVar14);
    } while (pbVar15 < data + len + -5);
  }
  uVar7 = this->numerusRulesLength;
  if (uVar7 != 0) {
    uVar10 = 0;
    do {
      if ((uVar10 + 1 == uVar7) || (bVar1 = this->numerusRulesArray[uVar10], (char)bVar1 < '\0'))
      goto LAB_002caebe;
      uVar11 = bVar1 & 7;
      uVar9 = uVar10 + 2;
      if (2 < uVar11 - 1) {
        if ((uVar11 != 4) || (uVar9 == uVar7)) goto LAB_002caebe;
        uVar9 = uVar10 + 3;
      }
      if (uVar9 == uVar7) break;
      uVar10 = uVar9 + 1;
      if ((uVar10 == uVar7) || (this->numerusRulesArray[uVar9] < 0xfd)) goto LAB_002caebe;
    } while( true );
  }
  std::
  vector<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
  ::reserve(&this->subTranslators,local_78.size);
  bVar6 = true;
  if (local_78.size != 0) {
    lVar12 = local_78.size * 0x18;
    pQVar14 = local_78.ptr;
    do {
      local_a0._M_head_impl = (QTranslator *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar8 = (QTranslator *)operator_new(0x10);
      QTranslator::QTranslator(pQVar8,(QObject *)0x0);
      local_48 = (undefined1 *)0x0;
      local_58._0_8_ = (QArrayData *)0x0;
      local_58._8_8_ = (QIODevice *)0x0;
      local_98.d.size = 0;
      local_98.d.d = (Data *)0x0;
      local_98.d.ptr = (char16_t *)0x0;
      local_a0._M_head_impl = pQVar8;
      bVar6 = QTranslator::load(pQVar8,pQVar14,directory,(QString *)local_58,&local_98);
      if (!bVar6) {
        if (local_a0._M_head_impl != (QTranslator *)0x0) {
          (*((local_a0._M_head_impl)->super_QObject)._vptr_QObject[4])();
        }
        puVar4 = (this->subTranslators).
                 super__Vector_base<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar5 = (this->subTranslators).
                 super__Vector_base<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        puVar13 = puVar4;
        if (puVar5 != puVar4) {
          do {
            pQVar8 = (puVar13->_M_t).
                     super___uniq_ptr_impl<QTranslator,_std::default_delete<QTranslator>_>._M_t.
                     super__Tuple_impl<0UL,_QTranslator_*,_std::default_delete<QTranslator>_>.
                     super__Head_base<0UL,_QTranslator_*,_false>._M_head_impl;
            if (pQVar8 != (QTranslator *)0x0) {
              (**(code **)((long)(pQVar8->super_QObject)._vptr_QObject + 0x20))();
            }
            (puVar13->_M_t).super___uniq_ptr_impl<QTranslator,_std::default_delete<QTranslator>_>.
            _M_t.super__Tuple_impl<0UL,_QTranslator_*,_std::default_delete<QTranslator>_>.
            super__Head_base<0UL,_QTranslator_*,_false>._M_head_impl = (QTranslator *)0x0;
            puVar13 = puVar13 + 1;
          } while (puVar13 != puVar5);
          (this->subTranslators).
          super__Vector_base<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = puVar4;
        }
LAB_002caebe:
        this->messageLength = 0;
        this->offsetLength = 0;
        this->contextLength = 0;
        this->numerusRulesLength = 0;
        this->contextArray = (uchar *)0x0;
        this->numerusRulesArray = (uchar *)0x0;
        this->messageArray = (uchar *)0x0;
        this->offsetArray = (uchar *)0x0;
        bVar6 = false;
        goto LAB_002caed8;
      }
      std::
      vector<std::unique_ptr<QTranslator,std::default_delete<QTranslator>>,std::allocator<std::unique_ptr<QTranslator,std::default_delete<QTranslator>>>>
      ::emplace_back<std::unique_ptr<QTranslator,std::default_delete<QTranslator>>>
                ((vector<std::unique_ptr<QTranslator,std::default_delete<QTranslator>>,std::allocator<std::unique_ptr<QTranslator,std::default_delete<QTranslator>>>>
                  *)&this->subTranslators,
                 (unique_ptr<QTranslator,_std::default_delete<QTranslator>_> *)&local_a0);
      if (local_a0._M_head_impl != (QTranslator *)0x0) {
        (*((local_a0._M_head_impl)->super_QObject)._vptr_QObject[4])();
      }
      pQVar14 = pQVar14 + 1;
      lVar12 = lVar12 + -0x18;
    } while (lVar12 != 0);
    bVar6 = true;
  }
LAB_002caed8:
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool QTranslatorPrivate::do_load(const uchar *data, qsizetype len, const QString &directory)
{
    bool ok = true;
    const uchar *end = data + len;

    data += MagicLength;

    QStringList dependencies;
    while (data < end - 5) {
        quint8 tag = read8(data++);
        quint32 blockLen = read32(data);
        data += 4;
        if (!tag || !blockLen)
            break;
        if (quint32(end - data) < blockLen) {
            ok = false;
            break;
        }

        if (tag == QTranslatorPrivate::Language) {
            language = QString::fromUtf8((const char *)data, blockLen);
        } else if (tag == QTranslatorPrivate::Contexts) {
            contextArray = data;
            contextLength = blockLen;
        } else if (tag == QTranslatorPrivate::Hashes) {
            offsetArray = data;
            offsetLength = blockLen;
        } else if (tag == QTranslatorPrivate::Messages) {
            messageArray = data;
            messageLength = blockLen;
        } else if (tag == QTranslatorPrivate::NumerusRules) {
            numerusRulesArray = data;
            numerusRulesLength = blockLen;
        } else if (tag == QTranslatorPrivate::Dependencies) {
            QDataStream stream(QByteArray::fromRawData((const char*)data, blockLen));
            QString dep;
            while (!stream.atEnd()) {
                stream >> dep;
                dependencies.append(dep);
            }
        }

        data += blockLen;
    }

    if (ok && !isValidNumerusRules(numerusRulesArray, numerusRulesLength))
        ok = false;
    if (ok) {
        subTranslators.reserve(std::size_t(dependencies.size()));
        for (const QString &dependency : std::as_const(dependencies)) {
            auto translator = std::make_unique<QTranslator>();
            ok = translator->load(dependency, directory);
            if (!ok)
                break;
            subTranslators.push_back(std::move(translator));
        }

        // In case some dependencies fail to load, unload all the other ones too.
        if (!ok)
            subTranslators.clear();
    }

    if (!ok) {
        messageArray = nullptr;
        contextArray = nullptr;
        offsetArray = nullptr;
        numerusRulesArray = nullptr;
        messageLength = 0;
        contextLength = 0;
        offsetLength = 0;
        numerusRulesLength = 0;
    }

    return ok;
}